

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O2

void store_helper(CPUArchState_conflict30 *env,target_ulong_conflict addr,uint64_t val,
                 TCGMemOpIdx oi,uintptr_t retaddr,MemOp op)

{
  int iVar1;
  uc_struct *uc;
  uc_struct_conflict15 *uc_00;
  hwaddr hVar2;
  byte bVar3;
  _Bool _Var4;
  char cVar5;
  uint uVar6;
  MemoryRegion *pMVar7;
  MemoryRegion_conflict *pMVar8;
  MemoryRegionSection *pMVar9;
  uint uVar10;
  uint size;
  uint uVar11;
  CPUTriCoreState *__mptr;
  byte bVar12;
  uint mmu_idx;
  uint page;
  void *pvVar13;
  CPUIOTLBEntry *iotlbentry;
  MemOp MVar14;
  ulong addr_00;
  uint *puVar15;
  ulong uVar16;
  ulong uVar17;
  list_item *plVar18;
  long lVar19;
  uint uVar20;
  uint uVar21;
  uint local_b4;
  CPUTriCoreState *__mptr_1;
  long local_a8;
  target_ulong_conflict local_9c;
  ulong local_80;
  uint local_68;
  ulong len;
  ulong mmu_idx_00;
  
  uc = (uc_struct *)env->uc;
  mmu_idx = oi & 0xf;
  mmu_idx_00 = (ulong)mmu_idx;
  uVar17 = (ulong)(mmu_idx << 4);
  uVar6 = addr >> 0xe;
  uVar20 = *(uint *)((long)env->gpr_a + (uVar17 - 0x40)) >> 6 & uVar6;
  local_80 = (ulong)uVar20;
  local_a8 = *(long *)((long)env->gpr_a + (uVar17 - 0x38));
  uVar16 = (ulong)(uVar20 << 6);
  local_b4 = *(uint *)(local_a8 + 4 + uVar16);
  uVar20 = get_alignment_bits(oi >> 4);
  MVar14 = op & MO_64;
  size = 1 << (sbyte)MVar14;
  len = (ulong)size;
  addr_00 = (ulong)addr;
  if ((~(-1 << ((byte)uVar20 & 0x1f)) & addr) != 0) {
    (**(code **)(*(long *)&env[-4].end_reset_fields + 0x18))
              (&env[-0x32].cpu_model,addr_00,1,mmu_idx,retaddr);
  }
  puVar15 = (uint *)((long)env->gpr_a + (uVar17 - 0x40));
  local_a8 = local_a8 + uVar16;
  local_68 = addr & 0xffffc000;
  if ((local_b4 & 0xffffe000) != (addr & 0xffffc000)) {
    _Var4 = victim_tlb_hit(env,mmu_idx_00,local_80,4,addr & 0xffffc000);
    if (!_Var4) {
      tlb_fill((CPUState *)&env[-0x32].cpu_model,addr,size,MMU_DATA_STORE,mmu_idx,retaddr);
      uVar20 = uVar6 & *puVar15 >> 6;
      local_80 = (ulong)uVar20;
      local_a8 = (ulong)(uVar20 << 6) + *(long *)((long)env->gpr_a + (uVar17 - 0x38));
    }
    local_b4 = *(uint *)(local_a8 + 4) & 0xffffdfff;
  }
  uVar20 = addr & 0x3fff;
  uVar16 = (ulong)(*(uint *)(local_a8 + 0xc) | uVar20);
  pMVar7 = (*uc->memory_mapping)(uc,uVar16);
  if (uc->size_recur_mem == 0) {
    plVar18 = (list_item *)(uc->hook + 0xb);
    do {
      plVar18 = plVar18->next;
      if ((plVar18 == (list_item *)0x0) || (pvVar13 = plVar18->data, pvVar13 == (void *)0x0)) break;
    } while ((*(char *)((long)pvVar13 + 0x14) != '\0') ||
            ((*(ulong *)((long)pvVar13 + 0x18) <= *(ulong *)((long)pvVar13 + 0x20) &&
              (*(ulong *)((long)pvVar13 + 0x20) < uVar16 ||
              uVar16 < *(ulong *)((long)pvVar13 + 0x18)) ||
             ((**(code **)((long)pvVar13 + 0x28))
                        (uc,0x11,uVar16,len,val,*(undefined8 *)((long)pvVar13 + 0x30)),
             uc->stop_request != true))));
  }
  if (pMVar7 == (MemoryRegion *)0x0) {
    plVar18 = (list_item *)(uc->hook + 5);
    do {
      do {
        plVar18 = plVar18->next;
        if ((plVar18 == (list_item *)0x0) || (pvVar13 = plVar18->data, pvVar13 == (void *)0x0))
        goto LAB_00b310f0;
      } while ((*(char *)((long)pvVar13 + 0x14) != '\0') ||
              (*(ulong *)((long)pvVar13 + 0x18) <= *(ulong *)((long)pvVar13 + 0x20) &&
               (*(ulong *)((long)pvVar13 + 0x20) < uVar16 ||
               uVar16 < *(ulong *)((long)pvVar13 + 0x18))));
      cVar5 = (**(code **)((long)pvVar13 + 0x28))
                        (uc,0x14,uVar16,len,val,*(undefined8 *)((long)pvVar13 + 0x30));
      if (cVar5 != '\0') {
        uc->invalid_error = 0;
        if ((local_b4 & 0xffffe000) != local_68) {
          _Var4 = victim_tlb_hit(env,mmu_idx_00,local_80,4,local_68);
          if (!_Var4) {
            tlb_fill((CPUState *)&env[-0x32].cpu_model,addr,size,MMU_DATA_STORE,mmu_idx,retaddr);
            uVar10 = uVar6 & *puVar15 >> 6;
            local_80 = (ulong)uVar10;
            local_a8 = (ulong)(uVar10 << 6) + *(long *)((long)env->gpr_a + (uVar17 - 0x38));
          }
          local_b4 = *(uint *)(local_a8 + 4) & 0xffffdfff;
        }
        uVar16 = (ulong)(*(uint *)(local_a8 + 0xc) | uVar20);
        pMVar7 = (*uc->memory_mapping)(uc,uVar16);
        if (pMVar7 != (MemoryRegion *)0x0) goto LAB_00b30f76;
        uc->invalid_error = 0xb;
        goto LAB_00b31101;
      }
    } while (uc->stop_request != true);
LAB_00b310f0:
    uc->invalid_addr = uVar16;
    uc->invalid_error = 7;
  }
  else {
LAB_00b30f76:
    if ((pMVar7->perms & 2) != 0) {
LAB_00b31127:
      if (((uc->snapshot_level != 0) && (pMVar7->ram == true)) &&
         (pMVar7->priority < uc->snapshot_level)) {
        pMVar8 = memory_cow_tricore((uc_struct_conflict15 *)uc,(MemoryRegion_conflict *)pMVar7,
                                    (ulong)local_68,0x4000);
        if (pMVar8 == (MemoryRegion_conflict *)0x0) {
          uc->invalid_addr = uVar16;
          uc->invalid_error = 1;
          goto LAB_00b31101;
        }
        tlb_fill((CPUState *)&env[-0x32].cpu_model,(target_ulong_conflict)uVar16,size,MMU_DATA_STORE
                 ,mmu_idx,retaddr);
        local_80._0_4_ = uVar6 & *puVar15 >> 6;
        lVar19 = *(long *)((long)env->gpr_a + (uVar17 - 0x38));
        local_a8 = lVar19 + (ulong)((uint)local_80 << 6);
        local_b4 = *(uint *)(lVar19 + 4 + (ulong)((uint)local_80 << 6));
      }
      if ((local_b4 & 0x3fff) == 0) {
        if ((MVar14 == MO_8) || (0xffffffffffffbfff < (ulong)(uVar20 + size) - 0x4001)) {
          pvVar13 = (void *)(addr_00 + *(long *)(local_a8 + 0x10));
LAB_00b311eb:
          store_memop(pvVar13,val,op);
          return;
        }
      }
      else if ((addr & size - 1) == 0) {
        iotlbentry = (CPUIOTLBEntry *)
                     (*(long *)((long)env + mmu_idx_00 * 0x2b0 + -0x5a8) +
                     (ulong)((uint)local_80 << 4));
        if ((local_b4 >> 10 & 1) != 0) {
          cpu_check_watchpoint_tricore
                    ((CPUState *)&env[-0x32].cpu_model,addr_00,len,iotlbentry->attrs,2,retaddr);
        }
        bVar12 = (byte)(local_b4 >> 9) & 1 & MVar14 != MO_8;
        if ((local_b4 >> 0xb & 1) != 0) {
          uc_00 = env->uc;
          pMVar9 = iotlb_to_section_tricore
                             ((CPUState *)&env[-0x32].cpu_model,iotlbentry->addr,iotlbentry->attrs);
          if (*(int *)((long)env[-4].irq + 0x34) != 0) {
            hVar2 = iotlbentry->addr;
            pMVar7 = pMVar9->mr;
            env[-4].irq[2] = (void *)retaddr;
            memory_region_dispatch_write_tricore
                      (uc_00,(MemoryRegion_conflict *)pMVar7,((uint)hVar2 & 0xffffc000) + addr_00,
                       val,(uint)bVar12 << 3 ^ op,iotlbentry->attrs);
            return;
          }
          cpu_io_recompile_tricore((CPUState *)&env[-0x32].cpu_model,retaddr);
        }
        if ((local_b4 >> 8 & 1) != 0) {
          return;
        }
        if ((local_b4 >> 0xc & 1) != 0) {
          notdirty_write((CPUState *)&env[-0x32].cpu_model,addr_00,size,iotlbentry,retaddr);
        }
        pvVar13 = (void *)(addr_00 + *(long *)(local_a8 + 0x10));
        if (bVar12 != 0) {
          op = op ^ MO_BE;
        }
        goto LAB_00b311eb;
      }
      uVar10 = (uint)(addr_00 + len);
      page = uVar10 & 0xffffc000;
      uVar20 = uVar10 & 0x3fff;
      uVar11 = (uint)(addr_00 + len >> 0xe) & 0x3ffff;
      uVar21 = *puVar15 >> 6 & uVar11;
      lVar19 = *(long *)((long)env->gpr_a + (uVar17 - 0x38));
      uVar6 = *(uint *)(lVar19 + 4 + (ulong)(uVar21 << 6));
      if ((uVar6 & 0xffffe000) != page) {
        _Var4 = victim_tlb_hit(env,mmu_idx_00,(ulong)uVar21,4,page);
        if (_Var4) {
          lVar19 = lVar19 + (ulong)(uVar21 << 6);
        }
        else {
          tlb_fill((CPUState *)&env[-0x32].cpu_model,page,uVar20,MMU_DATA_STORE,mmu_idx,retaddr);
          uVar21 = uVar11 & *puVar15 >> 6;
          lVar19 = (ulong)(uVar21 << 6) + *(long *)((long)env->gpr_a + (uVar17 - 0x38));
        }
        uVar6 = *(uint *)(lVar19 + 4);
      }
      if ((local_b4 >> 10 & 1) != 0) {
        cpu_check_watchpoint_tricore
                  ((CPUState *)&env[-0x32].cpu_model,addr_00,len - uVar20,
                   *(MemTxAttrs *)
                    (*(long *)((long)env + mmu_idx_00 * 0x2b0 + -0x5a8) + 8 +
                    (ulong)((uint)local_80 << 4)),2,retaddr);
      }
      if ((uVar6 >> 10 & 1) != 0) {
        cpu_check_watchpoint_tricore
                  ((CPUState *)&env[-0x32].cpu_model,(ulong)(uVar10 & 0xffffc000),(ulong)uVar20,
                   *(MemTxAttrs *)
                    (*(long *)((long)env + mmu_idx_00 * 0x2b0 + -0x5a8) + 8 + (ulong)(uVar21 << 4)),
                   2,retaddr);
      }
      iVar1 = uc->size_recur_mem;
      uc->size_recur_mem = size;
      lVar19 = len * 8;
      bVar12 = 0;
      local_9c = addr;
      while (lVar19 = lVar19 + -8, lVar19 != -8) {
        bVar3 = (byte)lVar19;
        if ((op & MO_BE) == MO_8) {
          bVar3 = bVar12;
        }
        helper_ret_stb_mmu_tricore(env,local_9c,(uint8_t)(val >> (bVar3 & 0x3f)),oi,retaddr);
        bVar12 = bVar12 + 8;
        local_9c = local_9c + 1;
      }
      uc->size_recur_mem = iVar1;
      return;
    }
    plVar18 = (list_item *)(uc->hook + 8);
    do {
      do {
        plVar18 = plVar18->next;
        if ((plVar18 == (list_item *)0x0) || (pvVar13 = plVar18->data, pvVar13 == (void *)0x0))
        goto LAB_00b30ff5;
      } while ((*(char *)((long)pvVar13 + 0x14) != '\0') ||
              (*(ulong *)((long)pvVar13 + 0x18) <= *(ulong *)((long)pvVar13 + 0x20) &&
               (*(ulong *)((long)pvVar13 + 0x20) < uVar16 ||
               uVar16 < *(ulong *)((long)pvVar13 + 0x18))));
      cVar5 = (**(code **)((long)pvVar13 + 0x28))
                        (uc,0x16,uVar16,len,val,*(undefined8 *)((long)pvVar13 + 0x30));
      if (cVar5 != '\0') {
        if ((local_b4 & 0xffffe000) != local_68) {
          _Var4 = victim_tlb_hit(env,mmu_idx_00,local_80,4,local_68);
          if (!_Var4) {
            tlb_fill((CPUState *)&env[-0x32].cpu_model,addr,size,MMU_DATA_STORE,mmu_idx,retaddr);
            uVar10 = uVar6 & *puVar15 >> 6;
            local_80 = (ulong)uVar10;
            local_a8 = (ulong)(uVar10 << 6) + *(long *)((long)env->gpr_a + (uVar17 - 0x38));
          }
          local_b4 = *(uint *)(local_a8 + 4) & 0xffffdfff;
        }
        uc->invalid_error = 0;
        goto LAB_00b31127;
      }
    } while (uc->stop_request == false);
LAB_00b30ff5:
    uc->invalid_addr = uVar16;
    uc->invalid_error = 0xc;
  }
LAB_00b31101:
  cpu_exit(uc->cpu);
  return;
}

Assistant:

static void inline
store_helper(CPUArchState *env, target_ulong addr, uint64_t val,
             TCGMemOpIdx oi, uintptr_t retaddr, MemOp op)
{
    struct uc_struct *uc = env->uc;
    HOOK_FOREACH_VAR_DECLARE;
    uintptr_t mmu_idx = get_mmuidx(oi);
    uintptr_t index = tlb_index(env, mmu_idx, addr);
    CPUTLBEntry *entry = tlb_entry(env, mmu_idx, addr);
    target_ulong tlb_addr = tlb_addr_write(entry);
    target_ulong paddr;
    const size_t tlb_off = offsetof(CPUTLBEntry, addr_write);
    unsigned a_bits = get_alignment_bits(get_memop(oi));
    void *haddr;
    size_t size = memop_size(op);
    struct hook *hook;
    bool handled;
    MemoryRegion *mr;

    /* Handle CPU specific unaligned behaviour */
    if (addr & ((1 << a_bits) - 1)) {
        cpu_unaligned_access(env_cpu(env), addr, MMU_DATA_STORE,
                             mmu_idx, retaddr);
    }

    /* If the TLB entry is for a different page, reload and try again.  */
    if (!tlb_hit(env->uc, tlb_addr, addr)) {
        if (!victim_tlb_hit(env, mmu_idx, index, tlb_off,
            addr & TARGET_PAGE_MASK)) {
            tlb_fill(env_cpu(env), addr, size, MMU_DATA_STORE,
                     mmu_idx, retaddr);
            index = tlb_index(env, mmu_idx, addr);
            entry = tlb_entry(env, mmu_idx, addr);
        }
        tlb_addr = tlb_addr_write(entry) & ~TLB_INVALID_MASK;
    }

    // Load the latest memory mapping.
    paddr = entry->paddr | (addr & ~TARGET_PAGE_MASK);
    mr = uc->memory_mapping(uc, paddr);

    if (!uc->size_recur_mem) { // disabling write callback if in recursive call
        // Unicorn: callback on memory write
        HOOK_FOREACH(uc, hook, UC_HOOK_MEM_WRITE) {
            if (hook->to_delete)
                continue;
            if (!HOOK_BOUND_CHECK(hook, paddr))
                continue;
            ((uc_cb_hookmem_t)hook->callback)(uc, UC_MEM_WRITE, paddr, size, val, hook->user_data);

            // the last callback may already asked to stop emulation
            if (uc->stop_request)
                break;
        }
    }

    // Unicorn: callback on invalid memory
    if (mr == NULL) {
        handled = false;
        HOOK_FOREACH(uc, hook, UC_HOOK_MEM_WRITE_UNMAPPED) {
            if (hook->to_delete)
                continue;
            if (!HOOK_BOUND_CHECK(hook, paddr))
                continue;
            if ((handled = ((uc_cb_eventmem_t)hook->callback)(uc, UC_MEM_WRITE_UNMAPPED, paddr, size, val, hook->user_data)))
                break;

            // the last callback may already asked to stop emulation
            if (uc->stop_request)
                break;
        }

        if (!handled) {
            // save error & quit
            uc->invalid_addr = paddr;
            uc->invalid_error = UC_ERR_WRITE_UNMAPPED;
            // printf("***** Invalid memory write at " TARGET_FMT_lx "\n", addr);
            cpu_exit(uc->cpu);
            return;
        } else {
            uc->invalid_error = UC_ERR_OK;
            /* If the TLB entry is for a different page, reload and try again.  */
            if (!tlb_hit(env->uc, tlb_addr, addr)) {
                if (!victim_tlb_hit(env, mmu_idx, index, tlb_off,
                    addr & TARGET_PAGE_MASK)) {
                    tlb_fill(env_cpu(env), addr, size, MMU_DATA_STORE,
                             mmu_idx, retaddr);
                    index = tlb_index(env, mmu_idx, addr);
                    entry = tlb_entry(env, mmu_idx, addr);
                }
                tlb_addr = tlb_addr_write(entry) & ~TLB_INVALID_MASK;
            }
            paddr = entry->paddr | (addr & ~TARGET_PAGE_MASK);
            mr = uc->memory_mapping(uc, paddr);
            if (mr == NULL) {
                uc->invalid_error = UC_ERR_MAP;
                cpu_exit(uc->cpu);
                return;
            }
        }
    }

    // Unicorn: callback on non-writable memory
    if (mr != NULL && !(mr->perms & UC_PROT_WRITE)) {  //non-writable
        // printf("not writable memory???\n");
        handled = false;
        HOOK_FOREACH(uc, hook, UC_HOOK_MEM_WRITE_PROT) {
            if (hook->to_delete)
                continue;
            if (!HOOK_BOUND_CHECK(hook, paddr))
                continue;
            if ((handled = ((uc_cb_eventmem_t)hook->callback)(uc, UC_MEM_WRITE_PROT, paddr, size, val, hook->user_data)))
                break;

            // the last callback may already asked to stop emulation
            if (uc->stop_request)
                break;
        }

        if (handled) {
            /* If the TLB entry is for a different page, reload and try again.  */
            if (!tlb_hit(env->uc, tlb_addr, addr)) {
                if (!victim_tlb_hit(env, mmu_idx, index, tlb_off,
                    addr & TARGET_PAGE_MASK)) {
                    tlb_fill(env_cpu(env), addr, size, MMU_DATA_STORE,
                             mmu_idx, retaddr);
                    index = tlb_index(env, mmu_idx, addr);
                    entry = tlb_entry(env, mmu_idx, addr);
                }
                tlb_addr = tlb_addr_write(entry) & ~TLB_INVALID_MASK;
            }
            uc->invalid_error = UC_ERR_OK;
        } else {
            uc->invalid_addr = paddr;
            uc->invalid_error = UC_ERR_WRITE_PROT;
            // printf("***** Invalid memory write (ro) at " TARGET_FMT_lx "\n", addr);
            cpu_exit(uc->cpu);
            return;
        }
    }

    if (uc->snapshot_level && mr->ram && mr->priority < uc->snapshot_level) {
        mr = memory_cow(uc, mr, addr & TARGET_PAGE_MASK, TARGET_PAGE_SIZE);
        if (!mr) {
            uc->invalid_addr = paddr;
            uc->invalid_error = UC_ERR_NOMEM;
            cpu_exit(uc->cpu);
            return;
        }
        /* refill tlb after CoW */
        tlb_fill(env_cpu(env), paddr, size, MMU_DATA_STORE,
                 mmu_idx, retaddr);
        index = tlb_index(env, mmu_idx, addr);
        entry = tlb_entry(env, mmu_idx, addr);
        tlb_addr = tlb_addr_write(entry);
    }

    /* Handle anything that isn't just a straight memory access.  */
    if (unlikely(tlb_addr & ~TARGET_PAGE_MASK)) {
        CPUIOTLBEntry *iotlbentry;
        bool need_swap;

        /* For anything that is unaligned, recurse through byte stores.  */
        if ((addr & (size - 1)) != 0) {
            goto do_unaligned_access;
        }

        iotlbentry = &env_tlb(env)->d[mmu_idx].iotlb[index];

        /* Handle watchpoints.  */
        if (unlikely(tlb_addr & TLB_WATCHPOINT)) {
            /* On watchpoint hit, this will longjmp out.  */
            cpu_check_watchpoint(env_cpu(env), addr, size,
                                 iotlbentry->attrs, BP_MEM_WRITE, retaddr);
        }

        need_swap = size > 1 && (tlb_addr & TLB_BSWAP);

        /* Handle I/O access.  */
        if (tlb_addr & TLB_MMIO) {
            io_writex(env, iotlbentry, mmu_idx, val, addr, retaddr,
                      op ^ (need_swap * MO_BSWAP));
            return;
        }

        /* Ignore writes to ROM.  */
        if (unlikely(tlb_addr & TLB_DISCARD_WRITE)) {
            return;
        }

        /* Handle clean RAM pages.  */
        if (tlb_addr & TLB_NOTDIRTY) {
            notdirty_write(env_cpu(env), addr, size, iotlbentry, retaddr);
        }

        haddr = (void *)((uintptr_t)addr + entry->addend);

        /*
         * Keep these two store_memop separate to ensure that the compiler
         * is able to fold the entire function to a single instruction.
         * There is a build-time assert inside to remind you of this.  ;-)
         */
        if (unlikely(need_swap)) {
            store_memop(haddr, val, op ^ MO_BSWAP);
        } else {
            store_memop(haddr, val, op);
        }
        return;
    }

    /* Handle slow unaligned access (it spans two pages or IO).  */
    if (size > 1
        && unlikely((addr & ~TARGET_PAGE_MASK) + size - 1
                     >= TARGET_PAGE_SIZE)) {
        int i;
        uintptr_t index2;
        CPUTLBEntry *entry2;
        target_ulong page2, tlb_addr2;
        size_t size2;
        int old_size;

    do_unaligned_access:
        /*
         * Ensure the second page is in the TLB.  Note that the first page
         * is already guaranteed to be filled, and that the second page
         * cannot evict the first.
         */
        page2 = (addr + size) & TARGET_PAGE_MASK;
        size2 = (addr + size) & ~TARGET_PAGE_MASK;
        index2 = tlb_index(env, mmu_idx, page2);
        entry2 = tlb_entry(env, mmu_idx, page2);
        tlb_addr2 = tlb_addr_write(entry2);
        if (!tlb_hit_page(uc, tlb_addr2, page2)) {
            if (!victim_tlb_hit(env, mmu_idx, index2, tlb_off, page2)) {
                tlb_fill(env_cpu(env), page2, size2, MMU_DATA_STORE,
                         mmu_idx, retaddr);
                index2 = tlb_index(env, mmu_idx, page2);
                entry2 = tlb_entry(env, mmu_idx, page2);
            }
            tlb_addr2 = tlb_addr_write(entry2);
        }

        /*
         * Handle watchpoints.  Since this may trap, all checks
         * must happen before any store.
         */
        if (unlikely(tlb_addr & TLB_WATCHPOINT)) {
            cpu_check_watchpoint(env_cpu(env), addr, size - size2,
                                 env_tlb(env)->d[mmu_idx].iotlb[index].attrs,
                                 BP_MEM_WRITE, retaddr);
        }
        if (unlikely(tlb_addr2 & TLB_WATCHPOINT)) {
            cpu_check_watchpoint(env_cpu(env), page2, size2,
                                 env_tlb(env)->d[mmu_idx].iotlb[index2].attrs,
                                 BP_MEM_WRITE, retaddr);
        }

        /*
         * XXX: not efficient, but simple.
         * This loop must go in the forward direction to avoid issues
         * with self-modifying code in Windows 64-bit.
         */
        old_size = uc->size_recur_mem;
        uc->size_recur_mem = size;
        for (i = 0; i < size; ++i) {
            uint8_t val8;
            if (memop_big_endian(op)) {
                /* Big-endian extract.  */
                val8 = val >> (((size - 1) * 8) - (i * 8));
            } else {
                /* Little-endian extract.  */
                val8 = val >> (i * 8);
            }
            helper_ret_stb_mmu(env, addr + i, val8, oi, retaddr);
        }
        uc->size_recur_mem = old_size;
        return;
    }

    haddr = (void *)((uintptr_t)addr + entry->addend);
    store_memop(haddr, val, op);
}